

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

bool __thiscall FileManager::seekVirtual(FileManager *this,int64_t virtualAddress)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  int sec;
  bool result;
  int64_t virtualAddress_local;
  FileManager *this_local;
  
  bVar1 = checkActiveFile(this);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->activeFile);
    uVar2 = (*peVar4->_vptr_AssemblerFile[9])(peVar4,virtualAddress);
    this_local._7_1_ = (bool)((byte)uVar2 & 1);
    if ((((uVar2 & 1) != 0) && ((Global.memoryMode & 1U) != 0)) &&
       (iVar3 = SymbolTable::findSection(&Global.symbolTable,virtualAddress), iVar3 != -1)) {
      Global.Section = iVar3;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FileManager::seekVirtual(int64_t virtualAddress)
{
	if (!checkActiveFile())
		return false;

	bool result = activeFile->seekVirtual(virtualAddress);
	if (result && Global.memoryMode)
	{
		int sec = Global.symbolTable.findSection(virtualAddress);
		if (sec != -1)
			Global.Section = sec;
	}

	return result;
}